

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifticdf.c
# Opt level: O2

double gsumln(double *a,double *b)

{
  double dVar1;
  double local_10;
  
  gsumln::x = *a + *b + -2.0;
  if (0.25 < gsumln::x) {
    if (gsumln::x <= 1.25) {
      local_10 = gamln1(&gsumln::x);
      dVar1 = alnrel(&gsumln::x);
    }
    else {
      gsumln::T2 = gsumln::x + -1.0;
      local_10 = gamln1(&gsumln::T2);
      dVar1 = log((gsumln::x + 1.0) * gsumln::x);
    }
    return dVar1 + local_10;
  }
  gsumln::T1 = gsumln::x + 1.0;
  dVar1 = gamln1(&gsumln::T1);
  return dVar1;
}

Assistant:

double gsumln(double *a,double *b)
/*
-----------------------------------------------------------------------
          EVALUATION OF THE FUNCTION LN(GAMMA(A + B))
          FOR 1 .LE. A .LE. 2  AND  1 .LE. B .LE. 2
-----------------------------------------------------------------------
*/
{
static double gsumln,x,T1,T2;
/*
     ..
     .. Executable Statements ..
*/
    x = *a+*b-2.e0;
    if(x > 0.25e0) goto S10;
    T1 = 1.0e0+x;
    gsumln = gamln1(&T1);
    return gsumln;
S10:
    if(x > 1.25e0) goto S20;
    gsumln = gamln1(&x)+alnrel(&x);
    return gsumln;
S20:
    T2 = x-1.0e0;
    gsumln = gamln1(&T2)+log(x*(1.0e0+x));
    return gsumln;
}